

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall pbrt::CameraSceneEntity::~CameraSceneEntity(CameraSceneEntity *this)

{
  SceneEntity *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI[6].name.field_2._M_local_buf + 8));
  SceneEntity::~SceneEntity(in_RDI);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}